

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::
     MatchPrintAndExplain<phmap::flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::FlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::FlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>const,phmap::flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::FlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::FlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>const&>
               (flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                *value,Matcher<const_phmap::flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>_&>
                       *matcher,MatchResultListener *listener)

{
  ctrl_t *pcVar1;
  size_t sVar2;
  anon_union_8_1_a8a14541_for_iterator_1 ptr;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  type_info *type;
  long lVar6;
  iterator local_208;
  string local_1e8;
  StringMatchResultListener inner_listener;
  
  if (listener->stream_ == (ostream *)0x0) {
    bVar3 = MatcherBase<const_phmap::flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>_&>
            ::Matches(&matcher->
                       super_MatcherBase<const_phmap::flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>_&>
                      ,value);
    return bVar3;
  }
  StringMatchResultListener::StringMatchResultListener(&inner_listener);
  bVar3 = MatcherBase<const_phmap::flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>_&>
          ::MatchAndExplain(&matcher->
                             super_MatcherBase<const_phmap::flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>_&>
                            ,value,&inner_listener.super_MatchResultListener);
  poVar5 = listener->stream_;
  std::operator<<(poVar5,'{');
  local_208 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
              ::begin(&value->
                       super_raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                     );
  pcVar1 = (value->
           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           ).ctrl_;
  sVar2 = (value->
          super_raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
          ).capacity_;
  lVar6 = 0;
  do {
    if (local_208.ctrl_ == pcVar1 + sVar2) {
      if (lVar6 != 0) {
LAB_00120a21:
        std::operator<<(poVar5,' ');
      }
      std::operator<<(poVar5,'}');
      GetTypeName_abi_cxx11_
                ((string *)&local_208,
                 (internal *)
                 &phmap::
                  flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::FlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::FlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                  ::typeinfo,type);
      bVar4 = IsReadableTypeName((string *)&local_208);
      if (bVar4) {
        poVar5 = std::operator<<(listener->stream_," (of type ");
        poVar5 = std::operator<<(poVar5,(string *)&local_208);
        std::operator<<(poVar5,")");
      }
      std::__cxx11::stringbuf::str();
      PrintIfNotEmpty(&local_1e8,listener->stream_);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      StringMatchResultListener::~StringMatchResultListener(&inner_listener);
      return bVar3;
    }
    ptr = local_208.field_1;
    if ((lVar6 != 0) && (std::operator<<(poVar5,','), lVar6 == 0x20)) {
      std::operator<<(poVar5," ...");
      goto LAB_00120a21;
    }
    std::operator<<(poVar5,' ');
    PrintTo<int,std::default_delete<int>>(ptr.slot_,poVar5);
    lVar6 = lVar6 + 1;
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
    ::iterator::operator++(&local_208);
  } while( true );
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}